

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

string * __thiscall
MADPComponentFactoredStates::SoftPrintState_abi_cxx11_(MADPComponentFactoredStates *this,Index sI)

{
  undefined4 in_EDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  MADPComponentFactoredStates *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s_vec;
  stringstream ss;
  MADPComponentFactoredStates *this_00;
  string local_1e8 [72];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  undefined4 in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  StateIndexToFactorValueIndices(this_00,(Index)((ulong)in_RDI >> 0x20));
  PrintTools::SoftPrintVector<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::operator<<(local_190,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::str();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RSI);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return (string *)this_00;
}

Assistant:

string MADPComponentFactoredStates::SoftPrintState(Index sI) const
{
    stringstream ss;
    vector<Index> s_vec = StateIndexToFactorValueIndices(sI);
    ss << SoftPrintVector(s_vec);
    return(ss.str());
    
}